

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toFloat.cpp
# Opt level: O0

uint halfToFloat(unsigned_short y)

{
  int iVar1;
  int m;
  int e;
  int s;
  unsigned_short y_local;
  
  iVar1 = (int)(uint)y >> 0xf;
  e = (int)(uint)y >> 10 & 0x1f;
  m = y & 0x3ff;
  if (e == 0) {
    if ((y & 0x3ff) == 0) {
      return iVar1 << 0x1f;
    }
    e = 0;
    for (; (m & 0x400U) == 0; m = m << 1) {
      e = e + -1;
    }
    e = e + 1;
    m = m & 0xfffffbff;
  }
  else if (e == 0x1f) {
    if ((y & 0x3ff) == 0) {
      return iVar1 << 0x1f | 0x7f800000;
    }
    return iVar1 << 0x1f | 0x7f800000U | m << 0xd;
  }
  return iVar1 << 0x1f | (e + 0x70) * 0x800000 | m << 0xd;
}

Assistant:

unsigned int
halfToFloat (unsigned short y)
{

    int s = (y >> 15) & 0x00000001;
    int e = (y >> 10) & 0x0000001f;
    int m =  y        & 0x000003ff;

    if (e == 0)
    {
	if (m == 0)
	{
	    //
	    // Plus or minus zero
	    //

	    return s << 31;
	}
	else
	{
	    //
	    // Denormalized number -- renormalize it
	    //

	    while (!(m & 0x00000400))
	    {
		m <<= 1;
		e -=  1;
	    }

	    e += 1;
	    m &= ~0x00000400;
	}
    }
    else if (e == 31)
    {
	if (m == 0)
	{
	    //
	    // Positive or negative infinity
	    //

	    return (s << 31) | 0x7f800000;
	}
	else
	{
	    //
	    // Nan -- preserve sign and significand bits
	    //

	    return (s << 31) | 0x7f800000 | (m << 13);
	}
    }

    //
    // Normalized number
    //

    e = e + (127 - 15);
    m = m << 13;

    //
    // Assemble s, e and m.
    //

    return (s << 31) | (e << 23) | m;
}